

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.h
# Opt level: O2

RefCountedPtr<raptor::Status> __thiscall
raptor::MakeStatusFromFormat<char_const(&)[21],char_const*&>
          (raptor *this,char (*args) [21],char **args_1)

{
  char *message;
  char *local_18;
  
  local_18 = (char *)0x0;
  raptor_asprintf(&local_18,*args,*args_1);
  if (local_18 == (char *)0x0) {
    *(undefined8 *)this = 0;
  }
  else {
    MakeRefCounted<raptor::Status,char*&>(this,&local_18);
    Free(local_18);
  }
  return (RefCountedPtr<raptor::Status>)(Status *)this;
}

Assistant:

inline RefCountedPtr<Status> MakeStatusFromFormat(Args&&... args) {
    char* message = nullptr;
    raptor_asprintf(&message, std::forward<Args>(args)...);
    if (!message) {
        return nullptr;
    }
    RefCountedPtr<Status> obj = MakeRefCounted<Status>(message);
    raptor::Free(message);
    return obj;
}